

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void bhdct_get(planck_unit_test_t *tc,ion_dictionary_t *dict,ion_key_t key,
              ion_value_t expected_value,ion_err_t expected_status,ion_result_count_t expected_count
              )

{
  long lVar1;
  ion_key_t key_00;
  planck_unit_test_t *state;
  ion_value_t __s1;
  int32_t expected;
  ion_result_count_t expected_00;
  planck_unit_result_t pVar2;
  int actual;
  ion_status_t iVar3;
  int line;
  size_t sVar4;
  undefined7 in_register_00000081;
  undefined1 *__s;
  ulong uVar5;
  undefined1 *__s_00;
  undefined8 uStack_60;
  undefined1 auStack_58 [8];
  ion_key_t local_50;
  planck_unit_test_t *local_48;
  ion_value_t local_40;
  int32_t local_38;
  ion_result_count_t local_34;
  
  local_38 = (int32_t)CONCAT71(in_register_00000081,expected_status);
  sVar4 = (size_t)(dict->instance->record).value_size;
  uVar5 = sVar4 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar5;
  __s = auStack_58 + lVar1;
  local_50 = key;
  local_48 = tc;
  local_40 = expected_value;
  local_34 = expected_count;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x1015be;
  memset(__s,0x76,sVar4);
  state = local_48;
  __s_00 = __s + -uVar5;
  *(undefined8 *)(__s_00 + -8) = 0x1015db;
  memset(__s_00,0x76,sVar4);
  key_00 = local_50;
  *(undefined8 *)(__s_00 + -8) = 0x1015ea;
  iVar3 = dictionary_get(dict,key_00,__s_00);
  expected = local_38;
  *(undefined8 *)(__s_00 + -8) = 0x101608;
  pVar2 = planck_unit_assert_int_are_equal
                    (state,expected,(int)iVar3.error,0xad,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  expected_00 = local_34;
  if (pVar2 != '\0') {
    *(undefined8 *)(__s_00 + -8) = 0x10162e;
    pVar2 = planck_unit_assert_int_are_equal
                      (state,expected_00,iVar3.count,0xae,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                      );
    __s1 = local_40;
    if (pVar2 != '\0') {
      sVar4 = (size_t)(dict->instance->record).value_size;
      if (((ulong)iVar3 & 0xff) == 0) {
        *(undefined8 *)(__s_00 + -8) = 0x10166c;
        actual = memcmp(__s1,__s_00,sVar4);
        line = 0xb1;
      }
      else {
        *(undefined8 *)(__s_00 + -8) = 0x10164b;
        actual = memcmp(__s,__s_00,sVar4);
        line = 0xb5;
      }
      *(undefined8 *)(__s_00 + -8) = 0x101684;
      pVar2 = planck_unit_assert_int_are_equal
                        (state,0,actual,line,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                        );
      if (pVar2 != '\0') {
        return;
      }
    }
  }
  *(code **)(__s_00 + -8) = bhdct_insert;
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
bhdct_get(
	planck_unit_test_t	*tc,
	ion_dictionary_t	*dict,
	ion_key_t			key,
	ion_value_t			expected_value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count
) {
	ion_value_t defaultval = alloca(dict->instance->record.value_size);

	memset(defaultval, 0x76, dict->instance->record.value_size);

	ion_value_t retval = alloca(dict->instance->record.value_size);

	memcpy(retval, defaultval, dict->instance->record.value_size);

	ion_status_t status = dictionary_get(dict, key, retval);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (err_ok == status.error) {
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(expected_value, retval, dict->instance->record.value_size));
	}
	else {
		/* Here, we check to see that the passed in space to write the value remains unchanged, if we have an error condition. */
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(defaultval, retval, dict->instance->record.value_size));
	}
}